

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Image(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,ImVec4 *tint_col,
                 ImVec4 *border_col)

{
  ImDrawList *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImVec2 *lhs;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  undefined1 local_50 [8];
  ImRect bb;
  ImGuiWindow *window;
  ImVec4 *border_col_local;
  ImVec4 *tint_col_local;
  ImVec2 *uv1_local;
  ImVec2 *uv0_local;
  ImVec2 *size_local;
  ImTextureID user_texture_id_local;
  
  bb.Max = (ImVec2)GetCurrentWindow();
  if ((*(bool *)((long)bb.Max + 0x93) & 1U) == 0) {
    lhs = (ImVec2 *)((long)bb.Max + 0xd8);
    local_58 = operator+(lhs,size);
    ImRect::ImRect((ImRect *)local_50,lhs,&local_58);
    if (0.0 < border_col->w) {
      ImVec2::ImVec2(&local_60,2.0,2.0);
      operator+=(&bb.Min,&local_60);
    }
    ItemSize((ImRect *)local_50,-1.0);
    bVar2 = ItemAdd((ImRect *)local_50,0,(ImRect *)0x0);
    if (bVar2) {
      if (border_col->w <= 0.0) {
        pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
        IVar3 = GetColorU32(tint_col);
        ImDrawList::AddImage(pIVar1,user_texture_id,(ImVec2 *)local_50,&bb.Min,uv0,uv1,IVar3);
      }
      else {
        pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
        IVar3 = GetColorU32(border_col);
        ImDrawList::AddRect(pIVar1,(ImVec2 *)local_50,&bb.Min,IVar3,0.0,0xf,1.0);
        pIVar1 = *(ImDrawList **)((long)bb.Max + 0x2b8);
        ImVec2::ImVec2(&local_70,1.0,1.0);
        local_68 = operator+((ImVec2 *)local_50,&local_70);
        ImVec2::ImVec2(&local_80,1.0,1.0);
        local_78 = operator-(&bb.Min,&local_80);
        IVar3 = GetColorU32(tint_col);
        ImDrawList::AddImage(pIVar1,user_texture_id,&local_68,&local_78,uv0,uv1,IVar3);
      }
    }
  }
  return;
}

Assistant:

void ImGui::Image(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& tint_col, const ImVec4& border_col)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    if (border_col.w > 0.0f)
        bb.Max += ImVec2(2, 2);
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
        return;

    if (border_col.w > 0.0f)
    {
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(border_col), 0.0f);
        window->DrawList->AddImage(user_texture_id, bb.Min + ImVec2(1, 1), bb.Max - ImVec2(1, 1), uv0, uv1, GetColorU32(tint_col));
    }
    else
    {
        window->DrawList->AddImage(user_texture_id, bb.Min, bb.Max, uv0, uv1, GetColorU32(tint_col));
    }
}